

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,LoopStatement *l)

{
  uint32_t index;
  Block *pBVar1;
  bool bVar2;
  Block *o;
  Block *o_00;
  VariableDeclaration *pVVar3;
  Variable *source;
  Variable *pVVar4;
  Expression *pEVar5;
  Constant *pCVar6;
  Expression *pEVar7;
  Constant *pCVar8;
  Block *local_598;
  bool local_469;
  bool local_369;
  pool_ptr<soul::heart::Block> local_330;
  pool_ptr<soul::AST::Statement> local_328;
  pool_ptr<soul::heart::Block> local_320;
  pool_ptr<soul::AST::Statement> local_318;
  pool_ptr<soul::heart::Block> local_310;
  pool_ptr<soul::heart::Block> local_308;
  pool_ptr<soul::AST::Constant> local_300;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::heart::Block> local_2f0;
  pool_ptr<soul::heart::Block> local_2e8;
  pool_ptr<soul::AST::Statement> local_2e0;
  pool_ptr<soul::heart::Block> local_2d8;
  CodeLocation local_2d0;
  Expression *local_2c0;
  Expression *isCounterInRange_1;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  Type local_270;
  Variable *local_258;
  Variable *counterVar_1;
  int64_t local_238;
  int64_t num;
  pool_ptr<soul::AST::Constant> constNumIterations;
  undefined1 local_1f0 [8];
  Type indexType;
  pool_ptr<soul::AST::Statement> local_1d0;
  pool_ptr<soul::heart::Block> local_1c8;
  Value local_1c0;
  CodeLocation local_180;
  Expression *local_170;
  Expression *isCounterInRange;
  PrimitiveType local_15c;
  Type local_158;
  pool_ptr<soul::AST::Expression> local_140;
  pool_ptr<soul::AST::Expression> init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  PrimitiveType local_f4;
  Type local_f0;
  Variable *local_d8;
  Variable *counterVar;
  undefined1 local_c8 [4];
  BoundedIntSize numIterations;
  undefined1 local_90 [8];
  Type type;
  pool_ptr<soul::AST::VariableDeclaration> rangeLoopVar;
  Block *bodyBlock;
  Block *startBlock;
  pool_ptr<soul::heart::Block> local_58;
  Block *local_50;
  Block *continueBlock;
  Block *local_38;
  Block *breakBlock;
  pool_ptr<soul::heart::Block> oldcontinueTarget;
  pool_ptr<soul::heart::Block> oldbreakTarget;
  uint32_t labelIndex;
  LoopStatement *l_local;
  HEARTGenerator *this_local;
  
  index = this->loopIndex;
  this->loopIndex = index + 1;
  oldcontinueTarget.object = (this->breakTarget).object;
  breakBlock = (this->continueTarget).object;
  local_38 = FunctionBuilder::createBlock(&this->builder,"@break_",index);
  local_50 = FunctionBuilder::createBlock(&this->builder,"@cont_",index);
  pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_58,local_38);
  (this->breakTarget).object = local_58.object;
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_58);
  pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>
            ((pool_ptr<soul::heart::Block> *)&startBlock,local_50);
  (this->continueTarget).object = startBlock;
  pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&startBlock);
  o = FunctionBuilder::createBlock(&this->builder,"@loop_",index);
  o_00 = FunctionBuilder::createBlock(&this->builder,"@body_",index);
  type.structure.object = (Structure *)(l->rangeLoopInitialiser).object;
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&type.structure);
  if (bVar2) {
    bVar2 = pool_ptr<soul::AST::Statement>::operator==(&l->iterator,(void *)0x0);
    local_369 = false;
    if (bVar2) {
      local_369 = pool_ptr<soul::AST::Expression>::operator==(&l->condition,(void *)0x0);
    }
    checkAssertion(local_369,"l.iterator == nullptr && l.condition == nullptr","visit",799);
    pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                       ((pool_ptr<soul::AST::VariableDeclaration> *)&type.structure);
    AST::VariableDeclaration::getType((Type *)local_90,pVVar3);
    bVar2 = Type::isBoundedInt((Type *)local_90);
    if (!bVar2) {
      pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                         ((pool_ptr<soul::AST::VariableDeclaration> *)&type.structure);
      Errors::rangeBasedForMustBeWrapType<>();
      AST::Context::throwError
                (&(pVVar3->super_Statement).super_ASTObject.context,(CompileMessage *)local_c8,false
                );
    }
    counterVar._4_4_ = Type::getBoundedIntLimit((Type *)local_90);
    Type::getBoundedIntSizeType();
    Type::Type(&local_f0,&local_f4);
    std::__cxx11::to_string((string *)&init,index);
    std::operator+(&local_118,"$counter_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&init);
    pVVar4 = BlockBuilder::createMutableLocalVariable
                       (&(this->builder).super_BlockBuilder,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&init);
    Type::~Type(&local_f0);
    local_d8 = pVVar4;
    pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                       ((pool_ptr<soul::AST::VariableDeclaration> *)&type.structure);
    local_140.object = (pVVar3->initialValue).object;
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_140);
    pVVar4 = local_d8;
    if (bVar2) {
      pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                         ((pool_ptr<soul::AST::VariableDeclaration> *)&type.structure);
      source = AST::VariableDeclaration::getGeneratedVariable(pVVar3);
      Type::getBoundedIntSizeType();
      Type::Type(&local_158,&local_15c);
      pEVar5 = BlockBuilder::createCastIfNeeded
                         (&(this->builder).super_BlockBuilder,&source->super_Expression,&local_158);
      BlockBuilder::addAssignment
                (&(this->builder).super_BlockBuilder,&pVVar4->super_Expression,pEVar5);
      Type::~Type(&local_158);
    }
    else {
      BlockBuilder::addZeroAssignment
                (&(this->builder).super_BlockBuilder,&local_d8->super_Expression);
    }
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_140);
    pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>
              ((pool_ptr<soul::heart::Block> *)&isCounterInRange,o);
    FunctionBuilder::beginBlock(&this->builder,(pool_ptr<soul::heart::Block> *)&isCounterInRange);
    pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&isCounterInRange);
    CodeLocation::CodeLocation(&local_180,&(l->super_Statement).super_ASTObject.context.location);
    pVVar4 = local_d8;
    soul::Value::Value(&local_1c0,counterVar._4_4_);
    pCVar6 = BlockBuilder::createConstant(&(this->builder).super_BlockBuilder,&local_1c0);
    pEVar5 = BlockBuilder::createBinaryOp
                       (&(this->builder).super_BlockBuilder,&local_180,&pVVar4->super_Expression,
                        &pCVar6->super_Expression,lessThan);
    soul::Value::~Value(&local_1c0);
    CodeLocation::~CodeLocation(&local_180);
    pBVar1 = local_38;
    local_170 = pEVar5;
    pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_1c8,o_00);
    FunctionBuilder::addBranchIf(&this->builder,pEVar5,o_00,pBVar1,&local_1c8);
    pool_ptr<soul::heart::Block>::~pool_ptr(&local_1c8);
    pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                       ((pool_ptr<soul::AST::VariableDeclaration> *)&type.structure);
    pVVar4 = AST::VariableDeclaration::getGeneratedVariable(pVVar3);
    BlockBuilder::addCastOrAssignment
              (&(this->builder).super_BlockBuilder,&pVVar4->super_Expression,
               &local_d8->super_Expression);
    local_1d0.object = (l->body).object;
    visitAsStatement(this,&local_1d0);
    pool_ptr<soul::AST::Statement>::~pool_ptr(&local_1d0);
    pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>
              ((pool_ptr<soul::heart::Block> *)&indexType.structure,local_50);
    FunctionBuilder::beginBlock(&this->builder,(pool_ptr<soul::heart::Block> *)&indexType.structure)
    ;
    pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&indexType.structure);
    BlockBuilder::incrementValue(&(this->builder).super_BlockBuilder,&local_d8->super_Expression);
    Type::~Type((Type *)local_90);
  }
  else {
    bVar2 = pool_ptr<soul::AST::Expression>::operator!=(&l->numIterations,(void *)0x0);
    if (bVar2) {
      bVar2 = pool_ptr<soul::AST::Statement>::operator==(&l->iterator,(void *)0x0);
      local_469 = false;
      if (bVar2) {
        local_469 = pool_ptr<soul::AST::Expression>::operator==(&l->condition,(void *)0x0);
      }
      checkAssertion(local_469,"l.iterator == nullptr && l.condition == nullptr","visit",0x33a);
      pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&l->numIterations);
      (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_1f0);
      bVar2 = Type::isPrimitiveInteger((Type *)local_1f0);
      if (!bVar2) {
        pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&l->numIterations);
        Errors::expectedInteger<>();
        AST::Context::throwError
                  (&(pEVar7->super_Statement).super_ASTObject.context,
                   (CompileMessage *)&constNumIterations,false);
      }
      bVar2 = Type::isInteger64((Type *)local_1f0);
      if (bVar2) {
        pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&l->numIterations);
        (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&num);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&num);
        if (bVar2) {
          pCVar8 = pool_ptr<soul::AST::Constant>::operator->((pool_ptr<soul::AST::Constant> *)&num);
          local_238 = soul::Value::getAsInt64(&pCVar8->value);
          if (local_238 < 0x80000000) {
            Type::Type((Type *)&counterVar_1,int32);
            Type::operator=((Type *)local_1f0,(Type *)&counterVar_1);
            Type::~Type((Type *)&counterVar_1);
          }
        }
        pool_ptr<soul::AST::Constant>::~pool_ptr((pool_ptr<soul::AST::Constant> *)&num);
      }
      Type::Type(&local_270,(Type *)local_1f0);
      std::__cxx11::to_string(&local_2b0,index);
      std::operator+(&local_290,"$counter_",&local_2b0);
      pVVar4 = BlockBuilder::createMutableLocalVariable
                         (&(this->builder).super_BlockBuilder,&local_270,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      Type::~Type(&local_270);
      local_258 = pVVar4;
      pEVar7 = pool_ptr<soul::AST::Expression>::operator*(&l->numIterations);
      pEVar5 = evaluateAsExpression(this,pEVar7);
      pEVar5 = BlockBuilder::createCastIfNeeded
                         (&(this->builder).super_BlockBuilder,pEVar5,(Type *)local_1f0);
      BlockBuilder::addAssignment
                (&(this->builder).super_BlockBuilder,&pVVar4->super_Expression,pEVar5);
      pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>
                ((pool_ptr<soul::heart::Block> *)&isCounterInRange_1,o);
      FunctionBuilder::beginBlock
                (&this->builder,(pool_ptr<soul::heart::Block> *)&isCounterInRange_1);
      pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&isCounterInRange_1);
      CodeLocation::CodeLocation(&local_2d0,&(l->super_Statement).super_ASTObject.context.location);
      pVVar4 = local_258;
      pCVar6 = BlockBuilder::createZeroInitialiser
                         (&(this->builder).super_BlockBuilder,(Type *)local_1f0);
      pEVar5 = BlockBuilder::createBinaryOp
                         (&(this->builder).super_BlockBuilder,&local_2d0,&pVVar4->super_Expression,
                          &pCVar6->super_Expression,greaterThan);
      CodeLocation::~CodeLocation(&local_2d0);
      pBVar1 = local_38;
      local_2c0 = pEVar5;
      pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_2d8,o_00);
      FunctionBuilder::addBranchIf(&this->builder,pEVar5,o_00,pBVar1,&local_2d8);
      pool_ptr<soul::heart::Block>::~pool_ptr(&local_2d8);
      local_2e0.object = (l->body).object;
      visitAsStatement(this,&local_2e0);
      pool_ptr<soul::AST::Statement>::~pool_ptr(&local_2e0);
      pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_2e8,local_50);
      FunctionBuilder::beginBlock(&this->builder,&local_2e8);
      pool_ptr<soul::heart::Block>::~pool_ptr(&local_2e8);
      BlockBuilder::decrementValue(&(this->builder).super_BlockBuilder,&local_258->super_Expression)
      ;
      Type::~Type((Type *)local_1f0);
    }
    else {
      pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_2f0,o);
      FunctionBuilder::beginBlock(&this->builder,&local_2f0);
      pool_ptr<soul::heart::Block>::~pool_ptr(&local_2f0);
      bVar2 = pool_ptr<soul::AST::Expression>::operator==(&l->condition,(void *)0x0);
      if (bVar2) {
        pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>
                  ((pool_ptr<soul::heart::Block> *)&c,o_00);
        FunctionBuilder::addBranch(&this->builder,o_00,(pool_ptr<soul::heart::Block> *)&c);
        pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&c);
      }
      else {
        pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&l->condition);
        (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_300);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_300);
        if (bVar2) {
          pCVar8 = pool_ptr<soul::AST::Constant>::operator->(&local_300);
          bVar2 = soul::Value::getAsBool(&pCVar8->value);
          local_598 = o_00;
          if (!bVar2) {
            local_598 = local_38;
          }
          pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_308,o_00);
          FunctionBuilder::addBranch(&this->builder,local_598,&local_308);
          pool_ptr<soul::heart::Block>::~pool_ptr(&local_308);
        }
        else {
          pEVar7 = pool_ptr<soul::AST::Expression>::operator*(&l->condition);
          pBVar1 = local_38;
          pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_310,o_00);
          addBranchIf(this,pEVar7,o_00,pBVar1,&local_310);
          pool_ptr<soul::heart::Block>::~pool_ptr(&local_310);
        }
        pool_ptr<soul::AST::Constant>::~pool_ptr(&local_300);
      }
      local_318.object = (l->body).object;
      visitAsStatement(this,&local_318);
      pool_ptr<soul::AST::Statement>::~pool_ptr(&local_318);
      pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_320,local_50);
      FunctionBuilder::beginBlock(&this->builder,&local_320);
      pool_ptr<soul::heart::Block>::~pool_ptr(&local_320);
      local_328.object = (l->iterator).object;
      visitAsStatement(this,&local_328);
      pool_ptr<soul::AST::Statement>::~pool_ptr(&local_328);
    }
  }
  pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr
            ((pool_ptr<soul::AST::VariableDeclaration> *)&type.structure);
  pool_ptr<soul::heart::Block>::pool_ptr<soul::heart::Block,void>(&local_330,local_38);
  FunctionBuilder::addBranch(&this->builder,o,&local_330);
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_330);
  (this->breakTarget).object = oldcontinueTarget.object;
  (this->continueTarget).object = breakBlock;
  pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&breakBlock);
  pool_ptr<soul::heart::Block>::~pool_ptr(&oldcontinueTarget);
  return;
}

Assistant:

void visit (AST::LoopStatement& l) override
    {
        auto labelIndex = loopIndex++;
        auto oldbreakTarget = breakTarget;
        auto oldcontinueTarget = continueTarget;
        auto& breakBlock    = builder.createBlock ("@break_", labelIndex);
        auto& continueBlock = builder.createBlock ("@cont_",  labelIndex);

        breakTarget = breakBlock;
        continueTarget = continueBlock;

        auto& startBlock = builder.createBlock ("@loop_", labelIndex);
        auto& bodyBlock  = builder.createBlock ("@body_", labelIndex);

        if (auto rangeLoopVar = l.rangeLoopInitialiser)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto type = rangeLoopVar->getType();

            if (! type.isBoundedInt())
                rangeLoopVar->context.throwError (Errors::rangeBasedForMustBeWrapType());

            auto numIterations = type.getBoundedIntLimit();
            auto& counterVar = builder.createMutableLocalVariable (Type::getBoundedIntSizeType(), "$counter_" + std::to_string (labelIndex));

            if (auto init = rangeLoopVar->initialValue)
                builder.addAssignment (counterVar, builder.createCastIfNeeded (rangeLoopVar->getGeneratedVariable(), Type::getBoundedIntSizeType()));
            else
                builder.addZeroAssignment (counterVar);

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createConstant (Value (numIterations)),
                                                             BinaryOp::Op::lessThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);

            builder.addCastOrAssignment (rangeLoopVar->getGeneratedVariable(), counterVar);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.incrementValue (counterVar);
        }
        else if (l.numIterations != nullptr)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto indexType = l.numIterations->getResultType();

            if (! indexType.isPrimitiveInteger())
                l.numIterations->context.throwError (Errors::expectedInteger());

            if (indexType.isInteger64())
            {
                if (auto constNumIterations = l.numIterations->getAsConstant())
                {
                    auto num = constNumIterations->value.getAsInt64();

                    if (num <= 0x7fffffff)
                        indexType = PrimitiveType::int32;
                }
            }

            auto& counterVar = builder.createMutableLocalVariable (indexType, "$counter_" + std::to_string (labelIndex));
            builder.addAssignment (counterVar, builder.createCastIfNeeded (evaluateAsExpression (*l.numIterations), indexType));

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createZeroInitialiser (indexType),
                                                             BinaryOp::Op::greaterThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.decrementValue (counterVar);
        }
        else
        {
            builder.beginBlock (startBlock);

            if (l.condition == nullptr)
                builder.addBranch (bodyBlock, bodyBlock);
            else if (auto c = l.condition->getAsConstant())
                builder.addBranch (c->value.getAsBool() ? bodyBlock : breakBlock, bodyBlock);
            else
                addBranchIf (*l.condition, bodyBlock, breakBlock, bodyBlock);

            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            visitAsStatement (l.iterator);
        }

        builder.addBranch (startBlock, breakBlock);
        breakTarget = oldbreakTarget;
        continueTarget = oldcontinueTarget;
    }